

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameclient.cpp
# Opt level: O0

void __thiscall CGameClient::OnPredict(CGameClient *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  CCollision *pCollision;
  IClient *pIVar4;
  undefined4 extraout_var;
  vec2 in_RDI;
  long in_FS_OFFSET;
  int c_1;
  int *pInput;
  int c;
  int Tick;
  int i_1;
  int i;
  CWorldCore World;
  uint in_stack_fffffffffffffd2c;
  uint in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd34;
  uint Events;
  CGameClient *in_stack_fffffffffffffd38;
  int local_2b4;
  int local_2a8;
  uint local_2a4;
  int local_2a0;
  int local_29c;
  vec2 Pos;
  CCharacterCore *in_stack_fffffffffffffd78;
  undefined1 in_stack_fffffffffffffdef;
  CCharacterCore *in_stack_fffffffffffffdf0;
  long alStack_208 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  Pos = in_RDI;
  bVar1 = IsWorldPaused((CGameClient *)in_RDI);
  if (bVar1) {
    for (local_29c = 0; local_29c < 0x40; local_29c = local_29c + 1) {
      if ((((CCharacterInfo *)((long)in_RDI + 0x1640))[local_29c].m_Active & 1U) != 0) {
        CCharacterCore::Read
                  ((CCharacterCore *)((long)in_RDI + (long)local_29c * 0x5b0 + 0x48d8),
                   (CNetObj_CharacterCore *)((long)in_RDI + (long)local_29c * 0xbc + 0x1644));
        CCharacterCore::Read
                  ((CCharacterCore *)((long)in_RDI + (long)local_29c * 0x5b0 + 0x4858),
                   (CNetObj_CharacterCore *)((long)in_RDI + (long)local_29c * 0xbc + 0x169c));
      }
    }
  }
  else {
    CWorldCore::CWorldCore
              ((CWorldCore *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
    memcpy(&stack0xfffffffffffffd78,(CTuningParams *)((long)in_RDI + 0xd28),0x80);
    for (local_2a0 = 0; local_2a0 < 0x40; local_2a0 = local_2a0 + 1) {
      if ((((CCharacterInfo *)((long)in_RDI + 0x1640))[local_2a0].m_Active & 1U) != 0) {
        in_stack_fffffffffffffd38 = (CGameClient *)((long)in_RDI + (long)local_2a0 * 0x5b0 + 0x4858)
        ;
        pCollision = Collision((CGameClient *)in_RDI);
        CCharacterCore::Init
                  ((CCharacterCore *)in_stack_fffffffffffffd38,
                   (CWorldCore *)&stack0xfffffffffffffd78,pCollision);
        alStack_208[local_2a0] = (long)in_RDI + (long)local_2a0 * 0x5b0 + 0x4858;
        CCharacterCore::Read
                  ((CCharacterCore *)((long)in_RDI + (long)local_2a0 * 0x5b0 + 0x4858),
                   (CNetObj_CharacterCore *)((long)in_RDI + (long)local_2a0 * 0xbc + 0x169c));
      }
    }
    pIVar4 = Client((CGameClient *)in_RDI);
    local_2a4 = IClient::GameTick(pIVar4);
    while( true ) {
      local_2a4 = local_2a4 + 1;
      Events = local_2a4;
      pIVar4 = Client((CGameClient *)in_RDI);
      iVar2 = IClient::PredGameTick(pIVar4);
      if (iVar2 < (int)Events) break;
      for (local_2a8 = 0; local_2a8 < 0x40; local_2a8 = local_2a8 + 1) {
        if (alStack_208[local_2a8] != 0) {
          in_stack_fffffffffffffd30 = local_2a4;
          pIVar4 = Client((CGameClient *)in_RDI);
          uVar3 = IClient::PredGameTick(pIVar4);
          if (in_stack_fffffffffffffd30 == uVar3) {
            memcpy((void *)((long)in_RDI + (long)local_2a8 * 0x5b0 + 0x48d8),
                   (void *)alStack_208[local_2a8],0x80);
          }
          mem_zero((void *)CONCAT44(Events,in_stack_fffffffffffffd30),in_stack_fffffffffffffd2c);
          if (*(int *)((long)in_RDI + 0x1b140) == local_2a8) {
            pIVar4 = Client((CGameClient *)in_RDI);
            iVar2 = (*(pIVar4->super_IInterface)._vptr_IInterface[0x18])(pIVar4,(ulong)local_2a4);
            if ((void *)CONCAT44(extraout_var,iVar2) != (void *)0x0) {
              memcpy((void *)(alStack_208[local_2a8] + 0x54),(void *)CONCAT44(extraout_var,iVar2),
                     0x28);
            }
            CCharacterCore::Tick(in_stack_fffffffffffffdf0,(bool)in_stack_fffffffffffffdef);
          }
          else {
            CCharacterCore::Tick(in_stack_fffffffffffffdf0,(bool)in_stack_fffffffffffffdef);
          }
        }
      }
      for (local_2b4 = 0; local_2b4 < 0x40; local_2b4 = local_2b4 + 1) {
        if (alStack_208[local_2b4] != 0) {
          CCharacterCore::AddDragVelocity
                    ((CCharacterCore *)CONCAT44(Events,in_stack_fffffffffffffd30));
          CCharacterCore::ResetDragVelocity
                    ((CCharacterCore *)CONCAT44(Events,in_stack_fffffffffffffd30));
          CCharacterCore::Move(in_stack_fffffffffffffd78);
          CCharacterCore::Quantize((CCharacterCore *)in_stack_fffffffffffffd38);
        }
      }
      if (((*(int *)((long)in_RDI + 0xd14) < (int)local_2a4) &&
          (*(uint *)((long)in_RDI + 0xd14) = local_2a4, *(int *)((long)in_RDI + 0x1b140) != -1)) &&
         (alStack_208[*(int *)((long)in_RDI + 0x1b140)] != 0)) {
        ProcessTriggeredEvents(in_stack_fffffffffffffd38,Events,Pos);
      }
    }
    pIVar4 = Client((CGameClient *)in_RDI);
    iVar2 = IClient::PredGameTick(pIVar4);
    *(int *)((long)in_RDI + 0xd10) = iVar2;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CGameClient::OnPredict()
{
	// Here we predict player movements. For the local player, we also predict
	// the result of the local input to make the game appear responsive even at
	// high latencies. For non-local players, we predict what will happen if
	// they don't apply any inputs. In both cases we are extrapolating
	// (predicting) what will happen between `GameTick` and `PredGameTick`.

	// don't predict anything if we are paused or round/game is over
	if(IsWorldPaused())
	{
		for(int i = 0; i < MAX_CLIENTS; i++)
		{
			if(!m_Snap.m_aCharacters[i].m_Active)
				continue;

			// instead of predicting into the future, just use the current and
			// previous snapshots that we already have
			m_aClients[i].m_PrevPredicted.Read(&m_Snap.m_aCharacters[i].m_Prev);
			m_aClients[i].m_Predicted.Read(&m_Snap.m_aCharacters[i].m_Cur);
		}

		return;
	}

	// repredict character
	CWorldCore World;
	World.m_Tuning = m_Tuning;

	// search for players
	for(int i = 0; i < MAX_CLIENTS; i++)
	{
		if(!m_Snap.m_aCharacters[i].m_Active)
			continue;

		m_aClients[i].m_Predicted.Init(&World, Collision());
		World.m_apCharacters[i] = &m_aClients[i].m_Predicted;
		m_aClients[i].m_Predicted.Read(&m_Snap.m_aCharacters[i].m_Cur);
	}

	// predict
	for(int Tick = Client()->GameTick() + 1;
		Tick <= Client()->PredGameTick();
		Tick++)
	{
		// first calculate where everyone should move
		for(int c = 0; c < MAX_CLIENTS; c++)
		{
			if(!World.m_apCharacters[c])
				continue;

			// Before running the last iteration, store our predictions. We use
			// `Prev` because we haven't run the last iteration yet, so our
			// data is from the previous tick.
			if(Tick == Client()->PredGameTick())
				m_aClients[c].m_PrevPredicted = *World.m_apCharacters[c];

			mem_zero(&World.m_apCharacters[c]->m_Input, sizeof(World.m_apCharacters[c]->m_Input));

			if(m_LocalClientID == c)
			{
				// apply player input
				const int *pInput = Client()->GetInput(Tick);
				if(pInput)
					World.m_apCharacters[c]->m_Input = *((const CNetObj_PlayerInput*)pInput);

				World.m_apCharacters[c]->Tick(true);
			}
			else
			{
				// don't apply inputs for non-local players
				World.m_apCharacters[c]->Tick(false);
			}
		}

		// move all players and quantize their data
		for(int c = 0; c < MAX_CLIENTS; c++)
		{
			if (!World.m_apCharacters[c])
				continue;

			World.m_apCharacters[c]->AddDragVelocity();
			World.m_apCharacters[c]->ResetDragVelocity();
			World.m_apCharacters[c]->Move();
			World.m_apCharacters[c]->Quantize();
		}

		// check if we want to trigger effects
		if(Tick > m_LastNewPredictedTick)
		{
			m_LastNewPredictedTick = Tick;

			// Only trigger effects for the local character here. Effects for
			// non-local characters are triggered in `OnNewSnapshot`. Since we
			// don't apply any inputs to non-local characters, it's not
			// necessary to trigger events for them here. Also, our predictions
			// for other players will often be wrong, so it's safer not to
			// trigger events here.
			if(m_LocalClientID != -1 && World.m_apCharacters[m_LocalClientID])
			{
				ProcessTriggeredEvents(
					World.m_apCharacters[m_LocalClientID]->m_TriggeredEvents,
					World.m_apCharacters[m_LocalClientID]->m_Pos
				);
			}
		}
	}

	m_PredictedTick = Client()->PredGameTick();
}